

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec16.c
# Opt level: O3

word If_CluDeriveDisjoint(word *pF,int nVars,int *V2P,int *P2V,If_Grp_t *g,If_Grp_t *r)

{
  size_t __n;
  byte bVar1;
  ulong uVar2;
  int nWords;
  uint uVar3;
  uint uVar4;
  word pCofs [3] [256];
  ulong local_1838 [256];
  long local_1038 [256];
  word local_838;
  
  uVar4 = nVars - g->nVars;
  If_CluCountCofs(pF,nVars,(int)g->nVars,0,(word (*) [256])local_1838);
  bVar1 = (byte)uVar4;
  if ((int)uVar4 < 6) {
    *pF = local_1038[0] << ((byte)(1 << (bVar1 & 0x1f)) & 0x3f) | local_1838[0];
LAB_003eef10:
    if (r == (If_Grp_t *)0x0) {
      return local_838;
    }
    r->nVars = bVar1 + 1;
    r->nMyu = '\0';
    if ((int)uVar4 < 1) goto LAB_003eef39;
  }
  else {
    if (uVar4 - 6 != 0x1f) {
      uVar3 = 1 << ((byte)(uVar4 - 6) & 0x1f);
      __n = (ulong)uVar3 * 8;
      memcpy(pF,local_1838,__n);
      memcpy(pF + (int)uVar3,local_1038,__n);
      goto LAB_003eef10;
    }
    if (r == (If_Grp_t *)0x0) {
      return local_838;
    }
    r->nVars = bVar1 + 1;
    r->nMyu = '\0';
  }
  uVar2 = 0;
  do {
    r->pVars[uVar2] = (char)P2V[uVar2];
    uVar2 = uVar2 + 1;
  } while (uVar4 != uVar2);
LAB_003eef39:
  r->pVars[(int)uVar4] = (char)nVars;
  return local_838;
}

Assistant:

word If_CluDeriveDisjoint( word * pF, int nVars, int * V2P, int * P2V, If_Grp_t * g, If_Grp_t * r )
{
    word pCofs[3][CLU_WRD_MAX/4];
    int i, RetValue, nFSset = nVars - g->nVars;
    RetValue = If_CluCountCofs( pF, nVars, g->nVars, 0, pCofs );
//    assert( RetValue == 2 );

    if ( nFSset < 6 )
        pF[0] = (pCofs[1][0] << (1 << nFSset)) | pCofs[0][0];
    else
    {
        If_CluCopy( pF, pCofs[0], nFSset );
        If_CluCopy( pF + If_CluWordNum(nFSset), pCofs[1], nFSset );
    }
    // create the resulting group
    if ( r )
    {
        r->nVars = nFSset + 1;
        r->nMyu = 0;
        for ( i = 0; i < nFSset; i++ )
            r->pVars[i] = P2V[i];
        r->pVars[nFSset] = nVars;
    }
    return pCofs[2][0];
}